

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O1

unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> __thiscall
S2Polygon::DestructiveApproxUnion
          (S2Polygon *this,
          vector<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
          *polygons,S1Angle snap_radius)

{
  _Rb_tree_color _Var1;
  _Rb_tree_color _Var2;
  pointer puVar3;
  S2Polygon *pSVar4;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> uVar5;
  _Head_base<0UL,_S2Polygon_*,_false> _Var6;
  pointer puVar7;
  scalar union_polygon;
  QueueType queue;
  _Head_base<0UL,_S2Polygon_*,_false> local_90;
  pair<int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_> local_88;
  S2Polygon *local_78;
  _Head_base<0UL,_S2Polygon_*,_false> local_70;
  S1Angle local_68;
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar7 = (polygons->
           super__Vector_base<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (polygons->
           super__Vector_base<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>,_std::allocator<std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_68.radians_ = snap_radius.radians_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (puVar7 != puVar3) {
    do {
      local_88.second._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
      super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
      super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl =
           (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
           (puVar7->_M_t).super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
           super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
           super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl;
      local_88.first =
           ((S2Polygon *)
           local_88.second._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>.
           _M_t.super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
           super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl)->num_vertices_;
      (puVar7->_M_t).super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
      super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
      super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl = (S2Polygon *)0x0;
      std::
      _Rb_tree<int,std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
      ::_M_emplace_equal<std::pair<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>
                ((_Rb_tree<int,std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
                  *)&local_60,&local_88);
      uVar5._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
      super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
      super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl =
           local_88.second._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>.
           _M_t.super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
           super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl;
      if (local_88.second._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>.
          _M_t.super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
          super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>)0x0) {
        ~S2Polygon((S2Polygon *)
                   local_88.second._M_t.
                   super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
                   super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
                   super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl);
        operator_delete((void *)uVar5._M_t.
                                super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>
                                .super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar3);
  }
  local_70._M_head_impl = this;
  if (1 < local_60._M_impl.super__Rb_tree_header._M_node_count) {
    do {
      _Var1 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      local_78 = (S2Polygon *)local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent = (_Base_ptr)0x0;
      std::
      _Rb_tree<int,std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
      ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
                          *)&local_60,
                         (iterator)local_60._M_impl.super__Rb_tree_header._M_header._M_left);
      _Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color;
      pSVar4 = (S2Polygon *)local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent = (_Base_ptr)0x0;
      std::
      _Rb_tree<int,std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
      ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
                          *)&local_60,
                         (iterator)local_60._M_impl.super__Rb_tree_header._M_header._M_left);
      absl::make_unique<S2Polygon>();
      s2builderutil::IdentitySnapFunction::IdentitySnapFunction
                ((IdentitySnapFunction *)&local_88,local_68);
      InitToOperation(local_90._M_head_impl,UNION,(SnapFunction *)&local_88,local_78,pSVar4);
      local_88.first = _Var2 + _Var1;
      local_88.second._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
      super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
      super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl =
           (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
           (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
           local_90._M_head_impl;
      local_90._M_head_impl = (S2Polygon *)0x0;
      std::
      _Rb_tree<int,std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
      ::_M_emplace_equal<std::pair<int,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>
                ((_Rb_tree<int,std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<S2Polygon,std::default_delete<S2Polygon>>>>>
                  *)&local_60,&local_88);
      uVar5._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
      super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
      super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl =
           (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
           (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)local_88.second;
      if (local_88.second._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>.
          _M_t.super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
          super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>)0x0) {
        ~S2Polygon((S2Polygon *)
                   local_88.second._M_t.
                   super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
                   super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
                   super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl);
        operator_delete((void *)uVar5._M_t.
                                super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>
                                .super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl);
      }
      ~S2Polygon(pSVar4);
      operator_delete(pSVar4);
      pSVar4 = local_78;
      ~S2Polygon(local_78);
      operator_delete(pSVar4);
    } while (1 < local_60._M_impl.super__Rb_tree_header._M_node_count);
  }
  _Var6._M_head_impl = local_70._M_head_impl;
  if (local_60._M_impl.super__Rb_tree_header._M_node_count == 0) {
    absl::make_unique<S2Polygon>();
  }
  else {
    ((local_70._M_head_impl)->super_S2Region)._vptr_S2Region =
         (_func_int **)local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_parent = (_Base_ptr)0x0;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
         (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)_Var6._M_head_impl;
}

Assistant:

unique_ptr<S2Polygon> S2Polygon::DestructiveApproxUnion(
    vector<unique_ptr<S2Polygon>> polygons, S1Angle snap_radius) {
  // Effectively create a priority queue of polygons in order of number of
  // vertices.  Repeatedly union the two smallest polygons and add the result
  // to the queue until we have a single polygon to return.
  using QueueType = std::multimap<int, unique_ptr<S2Polygon>>;
  QueueType queue;  // Map from # of vertices to polygon.
  for (auto& polygon : polygons)
    queue.insert(std::make_pair(polygon->num_vertices(), std::move(polygon)));

  while (queue.size() > 1) {
    // Pop two simplest polygons from queue.
    QueueType::iterator smallest_it = queue.begin();
    int a_size = smallest_it->first;
    unique_ptr<S2Polygon> a_polygon(std::move(smallest_it->second));
    queue.erase(smallest_it);
    smallest_it = queue.begin();
    int b_size = smallest_it->first;
    unique_ptr<S2Polygon> b_polygon(std::move(smallest_it->second));
    queue.erase(smallest_it);

    // Union and add result back to queue.
    auto union_polygon = make_unique<S2Polygon>();
    union_polygon->InitToApproxUnion(a_polygon.get(), b_polygon.get(),
                                     snap_radius);
    queue.insert(std::make_pair(a_size + b_size, std::move(union_polygon)));
    // We assume that the number of vertices in the union polygon is the
    // sum of the number of vertices in the original polygons, which is not
    // always true, but will almost always be a decent approximation, and
    // faster than recomputing.
  }

  if (queue.empty())
    return make_unique<S2Polygon>();
  else
    return std::move(queue.begin()->second);
}